

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,int iCursor,int isLeftJoin)

{
  int iVar1;
  Expr *pEVar2;
  Table *pTVar3;
  undefined1 local_60 [8];
  SubstContext x;
  int nChng;
  Expr *pNew;
  int isLeftJoin_local;
  int iCursor_local;
  Expr *pWhere_local;
  Select *pSubq_local;
  Parse *pParse_local;
  
  x.pEList._4_4_ = 0;
  if (pWhere == (Expr *)0x0) {
    pParse_local._4_4_ = 0;
  }
  else if ((pSubq->selFlags & 0x2000) == 0) {
    if (pSubq->pWin == (Window *)0x0) {
      _isLeftJoin_local = pWhere;
      if (pSubq->pLimit == (Expr *)0x0) {
        for (; _isLeftJoin_local->op == ','; _isLeftJoin_local = _isLeftJoin_local->pLeft) {
          iVar1 = pushDownWhereTerms(pParse,pSubq,_isLeftJoin_local->pRight,iCursor,isLeftJoin);
          x.pEList._4_4_ = iVar1 + x.pEList._4_4_;
        }
        if ((isLeftJoin == 0) ||
           (((_isLeftJoin_local->flags & 1) != 0 && (_isLeftJoin_local->iRightJoinTable == iCursor))
           )) {
          if (((_isLeftJoin_local->flags & 1) == 0) ||
             (_isLeftJoin_local->iRightJoinTable == iCursor)) {
            iVar1 = sqlite3ExprIsTableConstant(_isLeftJoin_local,iCursor);
            if (iVar1 != 0) {
              x.pEList._4_4_ = x.pEList._4_4_ + 1;
              for (pWhere_local = (Expr *)pSubq; pWhere_local != (Expr *)0x0;
                  pWhere_local = (Expr *)pWhere_local[1].u.zToken) {
                pEVar2 = sqlite3ExprDup(pParse->db,_isLeftJoin_local,0);
                unsetJoinExpr(pEVar2,-1);
                x.iTable = 0;
                x._16_8_ = *(undefined8 *)pWhere_local;
                local_60 = (undefined1  [8])pParse;
                x.pParse._0_4_ = iCursor;
                x.pParse._4_4_ = iCursor;
                pEVar2 = substExpr((SubstContext *)local_60,pEVar2);
                if (((ulong)(pWhere_local->u).zToken & 0x800000000) == 0) {
                  pEVar2 = sqlite3ExprAnd(pParse,*(Expr **)&pWhere_local->iColumn,pEVar2);
                  *(Expr **)&pWhere_local->iColumn = pEVar2;
                }
                else {
                  pTVar3 = (Table *)sqlite3ExprAnd(pParse,(Expr *)(pWhere_local->y).pTab,pEVar2);
                  (pWhere_local->y).pTab = pTVar3;
                }
              }
            }
            pParse_local._4_4_ = x.pEList._4_4_;
          }
          else {
            pParse_local._4_4_ = 0;
          }
        }
        else {
          pParse_local._4_4_ = 0;
        }
      }
      else {
        pParse_local._4_4_ = 0;
      }
    }
    else {
      pParse_local._4_4_ = 0;
    }
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  int iCursor,          /* Cursor number of the subquery */
  int isLeftJoin        /* True if pSubq is the right term of a LEFT JOIN */
){
  Expr *pNew;
  int nChng = 0;
  if( pWhere==0 ) return 0;
  if( pSubq->selFlags & SF_Recursive ) return 0;  /* restriction (2) */

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( pSubq->pWin ) return 0;    /* restriction (6) */
#endif

#ifdef SQLITE_DEBUG
  /* Only the first term of a compound can have a WITH clause.  But make
  ** sure no other terms are marked SF_Recursive in case something changes
  ** in the future.
  */
  {
    Select *pX;  
    for(pX=pSubq; pX; pX=pX->pPrior){
      assert( (pX->selFlags & (SF_Recursive))==0 );
    }
  }
#endif

  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight,
                                iCursor, isLeftJoin);
    pWhere = pWhere->pLeft;
  }
  if( isLeftJoin
   && (ExprHasProperty(pWhere,EP_FromJoin)==0
         || pWhere->iRightJoinTable!=iCursor)
  ){
    return 0; /* restriction (4) */
  }
  if( ExprHasProperty(pWhere,EP_FromJoin) && pWhere->iRightJoinTable!=iCursor ){
    return 0; /* restriction (5) */
  }
  if( sqlite3ExprIsTableConstant(pWhere, iCursor) ){
    nChng++;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      unsetJoinExpr(pNew, -1);
      x.pParse = pParse;
      x.iTable = iCursor;
      x.iNewTable = iCursor;
      x.isLeftJoin = 0;
      x.pEList = pSubq->pEList;
      pNew = substExpr(&x, pNew);
      if( pSubq->selFlags & SF_Aggregate ){
        pSubq->pHaving = sqlite3ExprAnd(pParse, pSubq->pHaving, pNew);
      }else{
        pSubq->pWhere = sqlite3ExprAnd(pParse, pSubq->pWhere, pNew);
      }
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}